

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymStr.c
# Opt level: O2

int Sim_SymmsIsCompatibleWithGroup(uint uSymm,Vec_Ptr_t *vNodesPi,int *pMap)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  uVar1 = vNodesPi->nSize;
  if (uVar1 != 0) {
    uVar4 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar4;
    }
    iVar5 = 0;
    iVar6 = 0;
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      iVar3 = iVar6;
      if (pMap[*(int *)(((ulong)vNodesPi->pArray[uVar4] & 0xfffffffffffffffe) + 0x10)] ==
          uSymm >> 0x10) {
        iVar3 = 1;
      }
      if (pMap[*(int *)(((ulong)vNodesPi->pArray[uVar4] & 0xfffffffffffffffe) + 0x10)] ==
          (uSymm & 0xffff)) {
        iVar5 = 1;
        iVar3 = iVar6;
      }
      iVar6 = iVar3;
    }
    return (int)(iVar5 == iVar6);
  }
  return 1;
}

Assistant:

int Sim_SymmsIsCompatibleWithGroup( unsigned uSymm, Vec_Ptr_t * vNodesPi, int * pMap )
{
    Abc_Obj_t * pNode;
    int i, Ind1, Ind2, fHasVar1, fHasVar2;

    if ( vNodesPi->nSize == 0 )
        return 1;

    // get the indices of the PI variables
    Ind1 = (uSymm & 0xffff);
    Ind2 = (uSymm >> 16);

    // go through the PI nodes
    fHasVar1 = fHasVar2 = 0;
    for ( i = 0; i < vNodesPi->nSize; i++ )
    {
        pNode = Abc_ObjRegular((Abc_Obj_t *)vNodesPi->pArray[i]);
        if ( pMap[pNode->Id] == Ind1 )
            fHasVar1 = 1;
        else if ( pMap[pNode->Id] == Ind2 )
            fHasVar2 = 1;
    }
    return fHasVar1 == fHasVar2;
}